

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paint.h
# Opt level: O1

void gimage::paste<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image2,long i0,long k0,
               int d0,float opacity)

{
  long i;
  long lVar1;
  long lVar2;
  long lVar3;
  long k;
  long lVar4;
  long lVar5;
  
  if (1.0 <= opacity) {
    if (0 < image2->depth) {
      lVar2 = 0;
      do {
        lVar3 = lVar2 + d0;
        if (((-1 < lVar3) && (lVar3 < image->depth)) && (0 < image2->height)) {
          lVar4 = 0;
          do {
            lVar5 = lVar4 + k0;
            if (((-1 < lVar5) && (lVar5 < image->height)) && (0 < image2->width)) {
              lVar1 = 0;
              do {
                if ((-1 < i0 + lVar1) && (i0 + lVar1 < image->width)) {
                  image->img[lVar3][lVar5][lVar1 + i0] = image2->img[lVar2][lVar4][lVar1];
                }
                lVar1 = lVar1 + 1;
              } while (lVar1 < image2->width);
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < image2->height);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < image2->depth);
    }
  }
  else if (0 < image2->depth) {
    if (opacity <= 0.0) {
      opacity = 0.0;
    }
    lVar2 = 0;
    do {
      lVar3 = lVar2 + d0;
      if (((-1 < lVar3) && (lVar3 < image->depth)) && (0 < image2->height)) {
        lVar4 = 0;
        do {
          lVar5 = lVar4 + k0;
          if (((-1 < lVar5) && (lVar5 < image->height)) && (0 < image2->width)) {
            lVar1 = 0;
            do {
              if ((-1 < i0 + lVar1) && (i0 + lVar1 < image->width)) {
                image->img[lVar3][lVar5][lVar1 + i0] =
                     (uchar)(int)((float)image2->img[lVar2][lVar4][lVar1] * opacity +
                                 (float)image->img[lVar3][lVar5][lVar1 + i0] * (1.0 - opacity));
              }
              lVar1 = lVar1 + 1;
            } while (lVar1 < image2->width);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < image2->height);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < image2->depth);
  }
  return;
}

Assistant:

void paste(Image<T> &image, const Image<T> &image2, long i0=0, long k0=0,
                             int d0=0, float opacity=1.0f)
{
  if (opacity < 1)
  {
    opacity=std::max(0.0f, opacity);

    for (int d=0; d<image2.getDepth(); d++)
      if (d0+d >= 0 && d0+d < image.getDepth())
        for (long k=0; k<image2.getHeight(); k++)
          if (k0+k >= 0 && k0+k < image.getHeight())
            for (long i=0; i<image2.getWidth(); i++)
              if (i0+i >= 0 && i0+i < image.getWidth())
              {
                float v=(1-opacity)*image.get(i0+i, k0+k, d0+d);
                v+=opacity*image2.get(i, k, d);
                image.set(i0+i, k0+k, d0+d, static_cast<typename Image<T>::store_t>(v));
              }
  }
  else
  {
    for (int d=0; d<image2.getDepth(); d++)
      if (d0+d >= 0 && d0+d < image.getDepth())
        for (long k=0; k<image2.getHeight(); k++)
          if (k0+k >= 0 && k0+k < image.getHeight())
            for (long i=0; i<image2.getWidth(); i++)
              if (i0+i >= 0 && i0+i < image.getWidth())
              {
                image.set(i0+i, k0+k, d0+d, image2.get(i, k, d));
              }
  }
}